

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerViewer.cpp
# Opt level: O2

void __thiscall
PathTracerViewer::create_gen_graphics_pipeline
          (PathTracerViewer *this,shared_ptr<myvk::Device> *device)

{
  initializer_list<std::shared_ptr<myvk::DescriptorSetLayout>_> __l;
  initializer_list<VkPushConstantRange> __l_00;
  initializer_list<VkPipelineShaderStageCreateInfo> __l_01;
  initializer_list<VkDynamicState> __l_02;
  allocator_type local_a41;
  undefined1 local_a40 [24];
  shared_ptr<myvk::ShaderModule> frag_shader_module;
  shared_ptr<myvk::ShaderModule> vert_shader_module;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  shader_stages;
  element_type *local_9e8;
  undefined1 local_9e0 [24];
  element_type *local_9c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9c0;
  VkSpecializationInfo *local_9b8;
  undefined1 auStack_9b0 [16];
  VertexInputState local_9a0;
  InputAssemblyState local_938;
  VkStructureType local_910;
  void *local_908;
  undefined8 uStack_900;
  bool local_8f8;
  ViewportState local_8f0;
  MultisampleState local_888;
  VkStructureType local_850;
  void *local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined1 local_828 [32];
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  bool local_7e8;
  ColorBlendState local_7e0;
  DynamicState local_788;
  uint32_t kPathTracerViewerGenFragSpirv [460];
  
  std::__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2> *)local_a40,
             &(((this->m_path_tracer_ptr).super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->m_target_descriptor_set_layout).
              super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 1;
  __l._M_array = (iterator)local_a40;
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
            *)kPathTracerViewerGenFragSpirv,__l,(allocator_type *)&frag_shader_module);
  vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x10;
  vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 4;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&vert_shader_module;
  std::vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::vector
            ((vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)local_9e0,__l_00,
             (allocator_type *)&local_9e8);
  myvk::PipelineLayout::Create
            ((PipelineLayout *)&shader_stages,device,
             (vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
              *)kPathTracerViewerGenFragSpirv,
             (vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)local_9e0);
  std::__shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_gen_pipeline_layout).
              super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2> *)&shader_stages);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &shader_stages.
              super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::~_Vector_base
            ((_Vector_base<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)local_9e0);
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
             *)kPathTracerViewerGenFragSpirv);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a40 + 8));
  memcpy(kPathTracerViewerGenFragSpirv,&DAT_0024ed20,0x730);
  vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::ShaderModule::Create((ShaderModule *)local_9e0,device,kQuadVertSpv,0x354);
  std::__shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2> *)local_9e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_9e0 + 8));
  myvk::ShaderModule::Create((ShaderModule *)local_9e0,device,kPathTracerViewerGenFragSpirv,0x730);
  std::__shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2> *)local_9e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_9e0 + 8));
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)local_9e0,
             vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,VK_SHADER_STAGE_VERTEX_BIT,(VkSpecializationInfo *)0x0);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)auStack_9b0,
             frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,VK_SHADER_STAGE_FRAGMENT_BIT,(VkSpecializationInfo *)0x0);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_9e0;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector(&shader_stages,__l_01,(allocator_type *)local_a40);
  local_9e0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_9e0._8_8_ = (element_type *)0x0;
  local_9e0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9c8 = (element_type *)0x0;
  _Stack_9c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9b8 = (VkSpecializationInfo *)0x0;
  auStack_9b0._0_8_ = 0;
  auStack_9b0._8_4_ = 0.0;
  local_9a0.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9a0.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9a0.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9a0.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9a0.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9a0.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9a0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_9a0.m_create_info.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  local_9a0.m_enable = false;
  local_9a0.m_create_info.pNext = (void *)0x0;
  local_9a0.m_create_info.flags = 0;
  local_9a0.m_create_info.vertexBindingDescriptionCount = 0;
  local_9a0.m_create_info.pVertexBindingDescriptions._0_4_ = 0;
  local_9a0.m_create_info._28_8_ = 0;
  local_938.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_938.m_enable = false;
  local_938.m_create_info.primitiveRestartEnable = 0;
  local_938.m_create_info.pNext = (void *)0x0;
  local_938.m_create_info.flags = 0;
  local_938.m_create_info.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_910 = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_8f8 = false;
  local_908 = (void *)0x0;
  uStack_900._0_4_ = 0;
  uStack_900._4_4_ = 0;
  local_8f0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8f0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8f0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8f0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8f0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8f0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8f0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_8f0.m_create_info.pScissors = (VkRect2D *)0x0;
  local_8f0.m_enable = false;
  local_8f0.m_create_info.pNext = (void *)0x0;
  local_8f0.m_create_info.flags = 0;
  local_8f0.m_create_info.viewportCount = 0;
  local_8f0.m_create_info.pViewports._0_4_ = 0;
  local_8f0.m_create_info._28_8_ = 0;
  local_888.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_888.m_create_info.alphaToCoverageEnable._0_1_ = 0;
  local_888._41_8_ = 0;
  local_888.m_create_info.sampleShadingEnable = 0;
  local_888.m_create_info.minSampleShading = 0.0;
  local_888.m_create_info.pSampleMask._0_1_ = 0;
  local_888.m_create_info.pSampleMask._1_7_ = 0;
  local_888.m_create_info.pNext = (void *)0x0;
  local_888.m_create_info.flags = 0;
  local_888.m_create_info.rasterizationSamples = 0;
  local_850 = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_848 = (void *)0x0;
  uStack_840._0_4_ = 0;
  uStack_840._4_4_ = 0;
  local_838._0_4_ = 0;
  local_838._4_4_ = VK_COMPARE_OP_NEVER;
  uStack_830._0_4_ = 0;
  uStack_830._4_4_ = 0;
  local_828._0_4_ = VK_STENCIL_OP_KEEP;
  local_828._4_4_ = VK_STENCIL_OP_KEEP;
  local_828._8_4_ = VK_STENCIL_OP_KEEP;
  local_828._12_4_ = VK_COMPARE_OP_NEVER;
  local_828._16_4_ = 0;
  local_828._20_4_ = 0;
  local_828._24_4_ = 0;
  local_828._28_4_ = VK_STENCIL_OP_KEEP;
  local_808._0_4_ = VK_STENCIL_OP_KEEP;
  local_808._4_4_ = VK_STENCIL_OP_KEEP;
  uStack_800._0_4_ = VK_COMPARE_OP_NEVER;
  uStack_800._4_4_ = 0;
  local_7f8._0_4_ = 0;
  local_7f8._4_4_ = 0;
  uStack_7f0._0_4_ = 0.0;
  uStack_7f0._4_4_ = 0.0;
  local_7e8 = false;
  local_7e0.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7e0.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7e0.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7e0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_7e0.m_enable = false;
  local_7e0.m_create_info.blendConstants[0] = 0.0;
  local_7e0.m_create_info.blendConstants[1] = 0.0;
  local_7e0.m_create_info.blendConstants[2] = 0.0;
  local_7e0.m_create_info.blendConstants[3] = 0.0;
  local_7e0.m_create_info.logicOp = VK_LOGIC_OP_CLEAR;
  local_7e0.m_create_info.attachmentCount = 0;
  local_7e0.m_create_info.pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
  local_7e0.m_create_info.pNext = (void *)0x0;
  local_7e0.m_create_info.flags = 0;
  local_7e0.m_create_info.logicOpEnable = 0;
  local_788.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_788.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_788.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_788.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_788.m_create_info.pDynamicStates._0_1_ = 0;
  local_788._49_8_ = 0;
  local_788.m_create_info.pNext = (void *)0x0;
  local_788.m_create_info.flags._0_1_ = 0;
  local_788.m_create_info._17_7_ = 0;
  myvk::GraphicsPipelineState::VertexInputState::Enable(&local_9a0);
  myvk::GraphicsPipelineState::InputAssemblyState::Enable
            (&local_938,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0);
  myvk::GraphicsPipelineState::ViewportState::Enable(&local_8f0,1,1);
  myvk::GraphicsPipelineState::RasterizationState::Initialize
            ((RasterizationState *)local_9e0,VK_POLYGON_MODE_FILL,VK_FRONT_FACE_COUNTER_CLOCKWISE,1)
  ;
  myvk::GraphicsPipelineState::MultisampleState::Enable(&local_888,VK_SAMPLE_COUNT_1_BIT);
  myvk::GraphicsPipelineState::ColorBlendState::Enable(&local_7e0,1,0);
  local_9e8 = (element_type *)0x100000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&local_9e8;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_a40,__l_02,&local_a41)
  ;
  myvk::GraphicsPipelineState::DynamicState::Enable
            (&local_788,(vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_a40);
  std::_Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>::~_Vector_base
            ((_Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_a40);
  myvk::GraphicsPipeline::Create
            ((GraphicsPipeline *)local_a40,&this->m_gen_pipeline_layout,&this->m_gen_render_pass,
             &shader_stages,(GraphicsPipelineState *)local_9e0,0);
  std::__shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_gen_graphics_pipeline).
              super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2> *)local_a40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a40 + 8));
  myvk::GraphicsPipelineState::~GraphicsPipelineState((GraphicsPipelineState *)local_9e0);
  std::
  _Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  ~_Vector_base(&shader_stages.
                 super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void PathTracerViewer::create_gen_graphics_pipeline(const std::shared_ptr<myvk::Device> &device) {
	m_gen_pipeline_layout = myvk::PipelineLayout::Create(device, {m_path_tracer_ptr->GetTargetDescriptorSetLayout()},
	                                                     {{VK_SHADER_STAGE_FRAGMENT_BIT, 0, sizeof(uint32_t)}});
	constexpr uint32_t kPathTracerViewerGenFragSpirv[] = {
#include "spirv/path_tracer_viewer_gen.frag.u32"
	};

	std::shared_ptr<myvk::ShaderModule> vert_shader_module, frag_shader_module;
	vert_shader_module = myvk::ShaderModule::Create(device, kQuadVertSpv, sizeof(kQuadVertSpv));
	frag_shader_module =
	    myvk::ShaderModule::Create(device, kPathTracerViewerGenFragSpirv, sizeof(kPathTracerViewerGenFragSpirv));

	std::vector<VkPipelineShaderStageCreateInfo> shader_stages = {
	    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
	    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

	myvk::GraphicsPipelineState pipeline_state = {};
	pipeline_state.m_vertex_input_state.Enable();
	pipeline_state.m_input_assembly_state.Enable(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	pipeline_state.m_viewport_state.Enable(1, 1);
	pipeline_state.m_rasterization_state.Initialize(VK_POLYGON_MODE_FILL, VK_FRONT_FACE_COUNTER_CLOCKWISE,
	                                                VK_CULL_MODE_FRONT_BIT);
	pipeline_state.m_multisample_state.Enable(VK_SAMPLE_COUNT_1_BIT);
	pipeline_state.m_color_blend_state.Enable(1, VK_FALSE);
	pipeline_state.m_dynamic_state.Enable({VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR});

	m_gen_graphics_pipeline =
	    myvk::GraphicsPipeline::Create(m_gen_pipeline_layout, m_gen_render_pass, shader_stages, pipeline_state, 0);
}